

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

int Gia_ManDupConeBack(Gia_Man_t *p,Gia_Man_t *pNew,Vec_Int_t *vCiIds)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  
  if (pNew->vCis->nSize != vCiIds->nSize) {
    __assert_fail("Gia_ManCiNum(pNew) == Vec_IntSize(vCiIds)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x7e2,"int Gia_ManDupConeBack(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  Gia_ManFillValue(pNew);
  pGVar3 = pNew->pObjs;
  pGVar3->Value = 0;
  lVar6 = (long)pNew->vCis->nSize;
  if (0 < lVar6) {
    piVar4 = pNew->vCis->pArray;
    lVar7 = 0;
    do {
      iVar1 = piVar4[lVar7];
      if (((long)iVar1 < 0) || (pNew->nObjs <= iVar1)) goto LAB_001e40c8;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if (vCiIds->nSize <= lVar7) goto LAB_001e40e7;
      iVar2 = vCiIds->pArray[lVar7];
      if (((long)iVar2 < 0) || (p->vCis->nSize <= iVar2)) goto LAB_001e40e7;
      iVar2 = p->vCis->pArray[iVar2];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_001e40c8;
      pGVar5 = p->pObjs;
      pGVar9 = (Gia_Obj_t *)((ulong)(pGVar5 + iVar2) & 0xfffffffffffffffe);
      if ((pGVar9 < pGVar5) || (pGVar5 + p->nObjs <= pGVar9)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar8 = (int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2);
      if (iVar8 * -0x55555555 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      pGVar3[iVar1].Value = ((uint)(pGVar5 + iVar2) & 1) + iVar8 * 0x55555556;
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  if (pNew->vCos->nSize < 1) {
LAB_001e40e7:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = *pNew->vCos->pArray;
  if ((-1 < (long)iVar1) && (iVar1 < pNew->nObjs)) {
    pGVar3 = pGVar3 + iVar1;
    Gia_ManDupConeBack_rec(p,pNew,pGVar3 + -(*(ulong *)pGVar3 & 0x1fffffff));
    if (-1 < (int)pGVar3[-(*(ulong *)pGVar3 & 0x1fffffff)].Value) {
      return (uint)(*(ulong *)pGVar3 >> 0x1d) & 1 ^ pGVar3[-(*(ulong *)pGVar3 & 0x1fffffff)].Value;
    }
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
LAB_001e40c8:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Gia_ManDupConeBack( Gia_Man_t * p, Gia_Man_t * pNew, Vec_Int_t * vCiIds )
{
    Gia_Obj_t * pObj, * pRoot; int i;
    assert( Gia_ManCiNum(pNew) == Vec_IntSize(vCiIds) );
    Gia_ManFillValue(pNew);
    Gia_ManConst0(pNew)->Value = 0;
    Gia_ManForEachCi( pNew, pObj, i )
        pObj->Value = Gia_Obj2Lit( p, Gia_ManCi(p, Vec_IntEntry(vCiIds, i)) );
    pRoot = Gia_ManCo(pNew, 0);
    Gia_ManDupConeBack_rec( p, pNew, Gia_ObjFanin0(pRoot) );
    return Gia_ObjFanin0Copy(pRoot);
}